

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::CommandCompare::compareHeader(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  vector<KTX_header2,_std::allocator<KTX_header2>_> *pvVar1;
  KTX_header2 *value1;
  pointer pKVar2;
  string_view what;
  string_view textHeaderIn;
  string_view textHeaderIn_00;
  string_view textHeaderIn_01;
  string_view textHeaderIn_02;
  string_view textHeaderIn_03;
  string_view textHeaderIn_04;
  string_view textHeaderIn_05;
  string_view textHeaderIn_06;
  string_view textHeaderIn_07;
  string_view textHeaderIn_08;
  string_view textHeaderIn_09;
  string_view textHeaderIn_10;
  string_view textHeaderIn_11;
  string_view textHeaderIn_12;
  string_view textHeaderIn_13;
  string_view textHeaderIn_14;
  string_view jsonPathIn;
  string_view jsonPathIn_00;
  string_view jsonPathIn_01;
  string_view jsonPathIn_02;
  string_view jsonPathIn_03;
  string_view jsonPathIn_04;
  string_view jsonPathIn_05;
  string_view jsonPathIn_06;
  string_view jsonPathIn_07;
  string_view jsonPathIn_08;
  string_view jsonPathIn_09;
  string_view jsonPathIn_10;
  string_view jsonPathIn_11;
  string_view jsonPathIn_12;
  string_view jsonPathIn_13;
  string_view jsonPathIn_14;
  DiffBase<unsigned_long> local_a8;
  ktx_uint32_t local_58;
  ktx_uint32_t local_54;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Header\n\n",(allocator<char> *)local_50._M_pod_data);
  PrintDiff::setContext(diff,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  what._M_str = "header";
  what._M_len = 6;
  read<KTX_header2>((vector<KTX_header2,_std::allocator<KTX_header2>_> *)&local_a8,this,streams,0,
                    what);
  pvVar1 = &this->headers;
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::_M_move_assign(pvVar1,&local_a8);
  std::_Vector_base<KTX_header2,_std::allocator<KTX_header2>_>::~_Vector_base
            ((_Vector_base<KTX_header2,_std::allocator<KTX_header2>_> *)&local_a8);
  value1 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  textHeaderIn._M_str = "identifier";
  textHeaderIn._M_len = 10;
  jsonPathIn._M_str = "/header/identifier";
  jsonPathIn._M_len = 0x12;
  DiffIdentifier::DiffIdentifier
            ((DiffIdentifier *)&local_a8,textHeaderIn,jsonPathIn,value1,value1 + 1);
  PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_char,_12UL>_> *)&local_a8);
  if ((this->options).super_OptionsCompare.ignoreFormatHeader == false) {
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_54 = pKVar2->vkFormat;
    local_58 = pKVar2[1].vkFormat;
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1465:13)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1465:13)>
               ::_M_manager;
    textHeaderIn_00._M_str = "vkFormat";
    textHeaderIn_00._M_len = 8;
    jsonPathIn_00._M_str = "/header/vkFormat";
    jsonPathIn_00._M_len = 0x10;
    local_50._M_unused._M_object = this;
    DiffEnum<VkFormat>::DiffEnum
              ((DiffEnum<VkFormat> *)&local_a8,textHeaderIn_00,jsonPathIn_00,(int32_t *)&local_54,
               (int32_t *)&local_58,(function<const_char_*(unsigned_long)> *)&local_50);
    PrintDiff::operator<<(diff,(DiffBase<VkFormat> *)&local_a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
    pKVar2 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    textHeaderIn_01._M_str = "typeSize";
    textHeaderIn_01._M_len = 8;
    jsonPathIn_01._M_str = "/header/typeSize";
    jsonPathIn_01._M_len = 0x10;
    Diff<unsigned_int>::Diff
              ((Diff<unsigned_int> *)&local_a8,textHeaderIn_01,jsonPathIn_01,&pKVar2->typeSize,
               &pKVar2[1].typeSize);
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
  }
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  textHeaderIn_02._M_str = "pixelWidth";
  textHeaderIn_02._M_len = 10;
  jsonPathIn_02._M_str = "/header/pixelWidth";
  jsonPathIn_02._M_len = 0x12;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)&local_a8,textHeaderIn_02,jsonPathIn_02,&pKVar2->pixelWidth,
             &pKVar2[1].pixelWidth);
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  textHeaderIn_03._M_str = "pixelHeight";
  textHeaderIn_03._M_len = 0xb;
  jsonPathIn_03._M_str = "/header/pixelHeight";
  jsonPathIn_03._M_len = 0x13;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)&local_a8,textHeaderIn_03,jsonPathIn_03,&pKVar2->pixelHeight,
             &pKVar2[1].pixelHeight);
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  textHeaderIn_04._M_str = "pixelDepth";
  textHeaderIn_04._M_len = 10;
  jsonPathIn_04._M_str = "/header/pixelDepth";
  jsonPathIn_04._M_len = 0x12;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)&local_a8,textHeaderIn_04,jsonPathIn_04,&pKVar2->pixelDepth,
             &pKVar2[1].pixelDepth);
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  textHeaderIn_05._M_str = "layerCount";
  textHeaderIn_05._M_len = 10;
  jsonPathIn_05._M_str = "/header/layerCount";
  jsonPathIn_05._M_len = 0x12;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)&local_a8,textHeaderIn_05,jsonPathIn_05,&pKVar2->layerCount,
             &pKVar2[1].layerCount);
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  textHeaderIn_06._M_str = "faceCount";
  textHeaderIn_06._M_len = 9;
  jsonPathIn_06._M_str = "/header/faceCount";
  jsonPathIn_06._M_len = 0x11;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)&local_a8,textHeaderIn_06,jsonPathIn_06,&pKVar2->faceCount,
             &pKVar2[1].faceCount);
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  textHeaderIn_07._M_str = "levelCount";
  textHeaderIn_07._M_len = 10;
  jsonPathIn_07._M_str = "/header/levelCount";
  jsonPathIn_07._M_len = 0x12;
  Diff<unsigned_int>::Diff
            ((Diff<unsigned_int> *)&local_a8,textHeaderIn_07,jsonPathIn_07,&pKVar2->levelCount,
             &pKVar2[1].levelCount);
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
  if ((this->options).super_OptionsCompare.ignoreSupercomp == false) {
    pKVar2 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    textHeaderIn_08._M_str = "supercompressionScheme";
    textHeaderIn_08._M_len = 0x16;
    jsonPathIn_08._M_str = "/header/supercompressionScheme";
    jsonPathIn_08._M_len = 0x1e;
    DiffEnum<ktxSupercmpScheme>::DiffEnum
              ((DiffEnum<ktxSupercmpScheme> *)&local_a8,textHeaderIn_08,jsonPathIn_08,
               &pKVar2->supercompressionScheme,&pKVar2[1].supercompressionScheme);
    PrintDiff::operator<<(diff,(DiffBase<ktxSupercmpScheme> *)&local_a8);
  }
  if ((this->options).super_OptionsCompare.ignoreIndex != all) {
    pKVar2 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    textHeaderIn_09._M_str = "dataFormatDescriptor.byteOffset";
    textHeaderIn_09._M_len = 0x1f;
    jsonPathIn_09._M_str = "/index/dataFormatDescriptor/byteOffset";
    jsonPathIn_09._M_len = 0x26;
    DiffHex<unsigned_int>::DiffHex
              ((DiffHex<unsigned_int> *)&local_a8,textHeaderIn_09,jsonPathIn_09,
               &(pKVar2->dataFormatDescriptor).byteOffset,&pKVar2[1].dataFormatDescriptor.byteOffset
              );
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
    pKVar2 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    textHeaderIn_10._M_str = "dataFormatDescriptor.byteLength";
    textHeaderIn_10._M_len = 0x1f;
    jsonPathIn_10._M_str = "/index/dataFormatDescriptor/byteLength";
    jsonPathIn_10._M_len = 0x26;
    Diff<unsigned_int>::Diff
              ((Diff<unsigned_int> *)&local_a8,textHeaderIn_10,jsonPathIn_10,
               &(pKVar2->dataFormatDescriptor).byteLength,&pKVar2[1].dataFormatDescriptor.byteLength
              );
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
    pKVar2 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    textHeaderIn_11._M_str = "keyValueData.byteOffset";
    textHeaderIn_11._M_len = 0x17;
    jsonPathIn_11._M_str = "/index/keyValueData/byteOffset";
    jsonPathIn_11._M_len = 0x1e;
    DiffHex<unsigned_int>::DiffHex
              ((DiffHex<unsigned_int> *)&local_a8,textHeaderIn_11,jsonPathIn_11,
               &(pKVar2->keyValueData).byteOffset,&pKVar2[1].keyValueData.byteOffset);
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
    pKVar2 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    textHeaderIn_12._M_str = "keyValueData.byteLength";
    textHeaderIn_12._M_len = 0x17;
    jsonPathIn_12._M_str = "/index/keyValueData/byteLength";
    jsonPathIn_12._M_len = 0x1e;
    Diff<unsigned_int>::Diff
              ((Diff<unsigned_int> *)&local_a8,textHeaderIn_12,jsonPathIn_12,
               &(pKVar2->keyValueData).byteLength,&pKVar2[1].keyValueData.byteLength);
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)&local_a8);
    pKVar2 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    textHeaderIn_13._M_str = "supercompressionGlobalData.byteOffset";
    textHeaderIn_13._M_len = 0x25;
    jsonPathIn_13._M_str = "/index/supercompressionGlobalData/byteOffset";
    jsonPathIn_13._M_len = 0x2c;
    DiffHex<unsigned_long>::DiffHex
              ((DiffHex<unsigned_long> *)&local_a8,textHeaderIn_13,jsonPathIn_13,
               &(pKVar2->supercompressionGlobalData).byteOffset,
               &pKVar2[1].supercompressionGlobalData.byteOffset);
    PrintDiff::operator<<(diff,&local_a8);
    pKVar2 = (pvVar1->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    textHeaderIn_14._M_str = "supercompressionGlobalData.byteLength";
    textHeaderIn_14._M_len = 0x25;
    jsonPathIn_14._M_str = "/index/supercompressionGlobalData/byteLength";
    jsonPathIn_14._M_len = 0x2c;
    Diff<unsigned_long>::Diff
              ((Diff<unsigned_long> *)&local_a8,textHeaderIn_14,jsonPathIn_14,
               &(pKVar2->supercompressionGlobalData).byteLength,
               &pKVar2[1].supercompressionGlobalData.byteLength);
    PrintDiff::operator<<(diff,&local_a8);
  }
  return;
}

Assistant:

void CommandCompare::compareHeader(PrintDiff& diff, InputStreams& streams) {
    diff.setContext("Header\n\n");

    headers = read<KTX_header2>(streams, 0, "header");

    diff << DiffIdentifier("identifier", "/header/identifier", headers[0], headers[1]);

    if (!options.ignoreFormatHeader) {
        diff << DiffEnum<VkFormat>("vkFormat", "/header/vkFormat", headers[0].vkFormat, headers[1].vkFormat,
            [&](auto i) { return vkFormatString(VkFormat(headers[i].vkFormat)); });
        diff << Diff("typeSize", "/header/typeSize", headers[0].typeSize, headers[1].typeSize);
    }

    diff << Diff("pixelWidth", "/header/pixelWidth", headers[0].pixelWidth, headers[1].pixelWidth);
    diff << Diff("pixelHeight", "/header/pixelHeight", headers[0].pixelHeight, headers[1].pixelHeight);
    diff << Diff("pixelDepth", "/header/pixelDepth", headers[0].pixelDepth, headers[1].pixelDepth);
    diff << Diff("layerCount", "/header/layerCount", headers[0].layerCount, headers[1].layerCount);
    diff << Diff("faceCount", "/header/faceCount", headers[0].faceCount, headers[1].faceCount);
    diff << Diff("levelCount", "/header/levelCount", headers[0].levelCount, headers[1].levelCount);

    if (!options.ignoreSupercomp)
        diff << DiffEnum<ktxSupercmpScheme>("supercompressionScheme", "/header/supercompressionScheme",
            headers[0].supercompressionScheme, headers[1].supercompressionScheme);

    if (options.ignoreIndex != IgnoreIndex::all) {
        diff << DiffHex("dataFormatDescriptor.byteOffset", "/index/dataFormatDescriptor/byteOffset",
            headers[0].dataFormatDescriptor.byteOffset, headers[1].dataFormatDescriptor.byteOffset);
        diff << Diff("dataFormatDescriptor.byteLength", "/index/dataFormatDescriptor/byteLength",
            headers[0].dataFormatDescriptor.byteLength, headers[1].dataFormatDescriptor.byteLength);

        diff << DiffHex("keyValueData.byteOffset", "/index/keyValueData/byteOffset",
            headers[0].keyValueData.byteOffset, headers[1].keyValueData.byteOffset);
        diff << Diff("keyValueData.byteLength", "/index/keyValueData/byteLength",
            headers[0].keyValueData.byteLength, headers[1].keyValueData.byteLength);

        diff << DiffHex("supercompressionGlobalData.byteOffset", "/index/supercompressionGlobalData/byteOffset",
            headers[0].supercompressionGlobalData.byteOffset, headers[1].supercompressionGlobalData.byteOffset);
        diff << Diff("supercompressionGlobalData.byteLength", "/index/supercompressionGlobalData/byteLength",
            headers[0].supercompressionGlobalData.byteLength, headers[1].supercompressionGlobalData.byteLength);
    }
}